

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void diy::
     reduce<void(*)(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&),diy::RegularSwapPartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,RegularSwapPartners *partners,
               _func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr **reduce,
               ReduceNeverSkip *skip)

{
  undefined4 uVar1;
  ReductionFunctor<void,_diy::RegularSwapPartners> *this;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  element_type *peVar8;
  size_type sVar9;
  ReductionFunctor<void,_diy::RegularSwapPartners> *in_RDX;
  Master *in_RDI;
  ReduceNeverSkip *in_R8;
  vector<int,_std::allocator<int>_> incoming_gids;
  uint i;
  int expected;
  uint round;
  int original_expected;
  shared_ptr<diy::spd::logger> log;
  Master *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip> *in_stack_fffffffffffffd08;
  SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip> *__f;
  Master *in_stack_fffffffffffffd10;
  RegularSwapPartners *in_stack_fffffffffffffd18;
  Master *in_stack_fffffffffffffd20;
  IncomingQueues *in_stack_fffffffffffffd28;
  ReductionFunctor<void,_diy::RegularSwapPartners> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  Master *in_stack_fffffffffffffd40;
  SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip> local_280 [2];
  SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip> local_248 [4];
  MemoryManagement *in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe2f;
  Master *in_stack_fffffffffffffe30;
  RegularSwapPartners local_1a8;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [64];
  undefined8 in_stack_fffffffffffffef8;
  uint local_40;
  int local_3c;
  ReduceNeverSkip *local_28;
  ReductionFunctor<void,_diy::RegularSwapPartners> *local_18;
  Master *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  get_logger();
  local_3c = Master::expected(local_8);
  local_40 = 0;
  while( true ) {
    uVar6 = (ulong)local_40;
    sVar7 = RegularPartners::rounds((RegularPartners *)0x20bdc7);
    iVar4 = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
    if (sVar7 <= uVar6) break;
    peVar8 = Catch::clara::std::
             __shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x20bde8);
    spd::logger::debug<unsigned_int>(peVar8,"Round {}",&stack0xffffffffffffffc0);
    std::function<void(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&)>::
    function<void(*const&)(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&),void>
              ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                *)in_stack_fffffffffffffd10,
               (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr **)
               in_stack_fffffffffffffd08);
    detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
              (in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
               (Callback *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (Assigner *)in_stack_fffffffffffffd10);
    detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip>::SkipInactiveOr
              ((SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip> *)
               (local_148 + 0x20),local_40,(RegularSwapPartners *)local_18,local_28);
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<diy::RegularSwapPartners,diy::detail::ReduceNeverSkip>,void>
              ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
              (in_stack_fffffffffffffd40,
               (ReductionFunctor<void,_diy::RegularSwapPartners> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               (Skip *)in_stack_fffffffffffffd30);
    Catch::clara::std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x20bebf);
    detail::ReductionFunctor<void,_diy::RegularSwapPartners>::~ReductionFunctor
              ((ReductionFunctor<void,_diy::RegularSwapPartners> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    Catch::clara::std::
    function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>::~function
              ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                *)0x20bed9);
    Master::execute((Master *)in_stack_fffffffffffffef8);
    local_148._28_4_ = 0;
    for (local_148._24_4_ = 0; uVar1 = local_148._24_4_, uVar3 = Master::size((Master *)0x20bf16),
        this = local_18, (uint)uVar1 < uVar3; local_148._24_4_ = local_148._24_4_ + 1) {
      iVar4 = local_40 + 1;
      iVar5 = Master::gid((Master *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                          (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      bVar2 = RegularSwapPartners::active((RegularSwapPartners *)this,iVar4,iVar5,local_8);
      if (bVar2) {
        in_stack_fffffffffffffd40 = (Master *)local_148;
        Catch::clara::std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x20bf97);
        in_stack_fffffffffffffd3c = local_40 + 1;
        in_stack_fffffffffffffd30 = local_18;
        Master::gid((Master *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
        RegularSwapPartners::incoming
                  ((RegularSwapPartners *)in_stack_fffffffffffffd10,
                   (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),(int)in_stack_fffffffffffffd08,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   in_stack_fffffffffffffcf8);
        sVar9 = Catch::clara::std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_148);
        local_148._28_4_ = local_148._28_4_ + (int)sVar9;
        in_stack_fffffffffffffd20 = local_8;
        Master::gid((Master *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
        in_stack_fffffffffffffd28 =
             Master::incoming((Master *)
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear((concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                 *)in_stack_fffffffffffffd10);
        Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10);
      }
    }
    Master::set_expected(local_8,local_148._28_4_);
    local_158 = 0;
    uStack_150 = 0;
    local_1a8.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.super_RegularPartners.contiguous_ = false;
    local_1a8.super_RegularPartners._49_7_ = 0;
    local_1a8.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super_RegularPartners.kvs_.
    super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super_RegularPartners.kvs_.
    super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.super_RegularPartners.divisions_.super__Vector_base<int,_std::allocator<int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.super_RegularPartners.kvs_.
    super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super_RegularPartners.divisions_.super__Vector_base<int,_std::allocator<int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super_RegularPartners.divisions_.super__Vector_base<int,_std::allocator<int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    in_stack_fffffffffffffd18 = &local_1a8;
    in_stack_fffffffffffffd10 = local_8;
    MemoryManagement::MemoryManagement
              ((MemoryManagement *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    Master::flush(in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f,
                  in_stack_fffffffffffffe20);
    MemoryManagement::~MemoryManagement
              ((MemoryManagement *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    local_40 = local_40 + 1;
  }
  peVar8 = Catch::clara::std::
           __shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x20c1df);
  spd::logger::debug<unsigned_int>(peVar8,"Round {}",&stack0xffffffffffffffc0);
  __f = local_248;
  uVar3 = local_40;
  std::function<void(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&)>::
  function<void(*const&)(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&),void>
            ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)> *)
             in_stack_fffffffffffffd10,
             (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr **)__f);
  detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
            (in_stack_fffffffffffffd30,iVar4,(Callback *)in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18,(Assigner *)in_stack_fffffffffffffd10);
  detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip>::SkipInactiveOr
            (local_280,local_40,(RegularSwapPartners *)local_18,local_28);
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<diy::RegularSwapPartners,diy::detail::ReduceNeverSkip>,void>
            ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffffd10,__f);
  Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
            (in_stack_fffffffffffffd40,
             (ReductionFunctor<void,_diy::RegularSwapPartners> *)
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (Skip *)in_stack_fffffffffffffd30);
  Catch::clara::std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x20c2b4);
  detail::ReductionFunctor<void,_diy::RegularSwapPartners>::~ReductionFunctor
            ((ReductionFunctor<void,_diy::RegularSwapPartners> *)
             CONCAT44(uVar3,in_stack_fffffffffffffd00));
  Catch::clara::std::
  function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>::~function
            ((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)> *)
             0x20c2ce);
  Master::set_expected(local_8,local_3c);
  Catch::clara::std::shared_ptr<diy::spd::logger>::~shared_ptr
            ((shared_ptr<diy::spd::logger> *)0x20c2ef);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}